

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestAllTypesLite_NestedMessage::Clear(TestAllTypesLite_NestedMessage *this)

{
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.dd_);
  if ((undefined1  [48])((undefined1  [48])this->field_0 & (undefined1  [48])0x3) !=
      (undefined1  [48])0x0) {
    (this->field_0)._impl_.bb_ = 0;
    (this->field_0)._impl_.cc_ = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestAllTypesLite_NestedMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestAllTypesLite.NestedMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.dd_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    ::memset(&_impl_.cc_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.bb_) -
        reinterpret_cast<char*>(&_impl_.cc_)) + sizeof(_impl_.bb_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}